

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O3

lzma_ret lzma_decode(void *coder_ptr,lzma_dict *dictptr,uint8_t *in,size_t *in_pos,size_t in_size)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  size_t sVar6;
  ulong uVar7;
  uint8_t *puVar8;
  size_t sVar9;
  byte bVar10;
  short sVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  lzma_ret lVar16;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  size_t sVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ushort *puVar27;
  uint8_t *__src;
  uint8_t *__dest;
  long lVar28;
  size_t sVar29;
  size_t sVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  ulong local_e8;
  ulong local_d8;
  uint local_cc;
  lzma_lzma_state local_c8;
  uint local_c4;
  size_t local_c0;
  void *local_b8;
  ulong local_b0;
  uint local_a8;
  uint local_94;
  
  iVar32 = *(int *)((long)coder_ptr + 0x6e74);
  if (iVar32 == 0) {
    uVar25 = *(uint *)((long)coder_ptr + 0x6e70);
    sVar30 = *in_pos;
  }
  else {
    sVar30 = *in_pos;
    lVar28 = 0;
    iVar22 = iVar32;
    do {
      iVar22 = iVar22 + -1;
      if ((sVar30 - in_size) + lVar28 == 0) {
        return LZMA_OK;
      }
      uVar25 = (uint)in[lVar28 + sVar30];
      if (((int)lVar28 - iVar32 == -5) && (uVar25 = 0, in[lVar28 + sVar30] != 0)) {
        return LZMA_DATA_ERROR;
      }
      uVar25 = *(int *)((long)coder_ptr + 0x6e70) << 8 | uVar25;
      *(uint *)((long)coder_ptr + 0x6e70) = uVar25;
      *in_pos = sVar30 + lVar28 + 1;
      *(int *)((long)coder_ptr + 0x6e74) = iVar22;
      lVar28 = lVar28 + 1;
    } while ((int)lVar28 != iVar32);
    sVar30 = sVar30 + lVar28;
  }
  sVar6 = dictptr->pos;
  local_c0 = dictptr->full;
  sVar17 = dictptr->limit;
  uVar31 = *(uint *)((long)coder_ptr + 0x6e6c);
  local_c8 = *(lzma_lzma_state *)((long)coder_ptr + 0x6e78);
  local_e8._0_4_ = *(uint *)((long)coder_ptr + 0x6e7c);
  uVar19 = (ulong)(uint)local_e8;
  local_c4 = *(uint *)((long)coder_ptr + 0x6e80);
  local_cc = *(uint *)((long)coder_ptr + 0x6e84);
  local_94 = *(uint *)((long)coder_ptr + 0x6e88);
  local_b8 = *(void **)((long)coder_ptr + 0x6ea8);
  local_a8 = *(uint *)((long)coder_ptr + 0x6eb0);
  uVar23 = (ulong)local_a8;
  uVar7 = *(ulong *)((long)coder_ptr + 0x6e98);
  sVar21 = uVar7 + sVar6;
  if (sVar17 - sVar6 <= uVar7) {
    sVar21 = sVar17;
  }
  uVar26 = *(uint *)((long)coder_ptr + 0x6eb4);
  if (uVar7 == 0xffffffffffffffff) {
    sVar21 = sVar17;
  }
  uVar15 = *(uint *)((long)coder_ptr + 0x6eb8);
  uVar33 = *(uint *)((long)coder_ptr + 0x6ebc);
  local_d8 = (ulong)uVar33;
  sVar17 = sVar6;
  if (*(uint *)((long)coder_ptr + 0x6ea0) < 0x47) {
    puVar8 = dictptr->buf;
    sVar9 = dictptr->size;
    uVar3 = *(uint *)((long)coder_ptr + 0x6e8c);
    uVar4 = *(uint *)((long)coder_ptr + 0x6e94);
    uVar5 = *(undefined4 *)((long)coder_ptr + 0x6e90);
    local_b0 = (ulong)((uint)sVar6 & uVar3);
    uVar34 = uVar23;
    uVar24 = uVar23;
    sVar29 = sVar6;
    uVar20 = uVar25;
    local_e8 = uVar19;
    uVar14 = uVar15;
    switch(*(uint *)((long)coder_ptr + 0x6ea0)) {
    default:
      do {
        local_a8 = (uint)uVar23;
        if ((uVar7 != 0xffffffffffffffff) &&
           (sVar17 = sVar21, uVar33 = (uint)local_d8, sVar29 == sVar21)) break;
        uVar33 = uVar31;
        if (uVar31 < 0x1000000) {
          if (sVar30 == in_size) {
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
            bVar13 = false;
            bVar12 = true;
            lVar16 = LZMA_OK;
            goto LAB_001a5f99;
          }
          pbVar1 = in + sVar30;
          sVar30 = sVar30 + 1;
          uVar25 = uVar25 << 8 | (uint)*pbVar1;
          uVar33 = uVar31 << 8;
        }
        puVar27 = (ushort *)((long)coder_ptr + local_b0 * 2 + (ulong)local_c8 * 0x20 + 0x6000);
        uVar2 = *puVar27;
        uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
        uVar20 = uVar25 - uVar31;
        if (uVar25 < uVar31) {
          *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
          bVar10 = (byte)uVar5;
          sVar17 = 0;
          if (sVar29 == 0) {
            sVar17 = sVar9;
          }
          local_b8 = (void *)(((ulong)(puVar8[(sVar17 - 1) + sVar29] >> (8 - bVar10 & 0x1f)) +
                              ((ulong)((uint)sVar29 & uVar4) << (bVar10 & 0x3f))) * 0x600 +
                             (long)coder_ptr);
          uVar23 = 1;
          if (local_c8 < STATE_LIT_MATCH) {
switchD_001a2e9a_caseD_2:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 2;
                goto LAB_001a5b0b;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar25 = uVar25 << 8 | (uint)*pbVar1;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar24 = (ulong)uVar14;
            uVar20 = uVar25 - uVar31;
            if (uVar25 < uVar31) {
              *(ushort *)((long)local_b8 + uVar23 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar20 = uVar25;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)local_b8 + uVar23 * 2) = uVar2 - (uVar2 >> 5);
              uVar24 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_3:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 != in_size) {
                pbVar1 = in + sVar30;
                sVar30 = sVar30 + 1;
                uVar20 = uVar20 << 8 | (uint)*pbVar1;
                uVar33 = uVar31 << 8;
                goto LAB_001a30c6;
              }
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 3;
              uVar25 = uVar20;
LAB_001a5f88:
              local_a8 = (uint)uVar24;
LAB_001a5f94:
              lVar16 = LZMA_OK;
              bVar13 = false;
              bVar12 = true;
              goto LAB_001a5f99;
            }
LAB_001a30c6:
            uVar2 = *(ushort *)((long)local_b8 + uVar24 * 2);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar24 * 2;
            uVar34 = (ulong)uVar14;
            uVar25 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              *(ushort *)((long)local_b8 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar20;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)local_b8 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_4:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 4;
                uVar24 = uVar34;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar25 = uVar25 << 8 | (uint)*pbVar1;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar34 * 2);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar34 * 2;
            uVar23 = (ulong)uVar14;
            uVar20 = uVar25 - uVar31;
            if (uVar25 < uVar31) {
              *(ushort *)((long)local_b8 + uVar34 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar20 = uVar25;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)local_b8 + uVar34 * 2) = uVar2 - (uVar2 >> 5);
              uVar23 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_5:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 5;
                uVar24 = uVar23;
                uVar25 = uVar20;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar24 = (ulong)uVar14;
            uVar25 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              *(ushort *)((long)local_b8 + uVar23 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar20;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)local_b8 + uVar23 * 2) = uVar2 - (uVar2 >> 5);
              uVar24 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_6:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 6;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar25 = (uint)*pbVar1 | uVar25 << 8;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar24 * 2);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar24 * 2;
            uVar23 = (ulong)uVar14;
            uVar20 = uVar25 - uVar31;
            if (uVar25 < uVar31) {
              *(ushort *)((long)local_b8 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar20 = uVar25;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)local_b8 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
              uVar23 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_7:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 7;
                uVar24 = uVar23;
                uVar25 = uVar20;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar24 = (ulong)uVar14;
            uVar25 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              *(ushort *)((long)local_b8 + uVar23 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar20;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)local_b8 + uVar23 * 2) = uVar2 - (uVar2 >> 5);
              uVar24 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_8:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 8;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar25 = (uint)*pbVar1 | uVar25 << 8;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar24 * 2);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar24 * 2;
            uVar23 = (ulong)uVar14;
            uVar20 = uVar25 - uVar31;
            if (uVar25 < uVar31) {
              *(ushort *)((long)local_b8 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar20 = uVar25;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)local_b8 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
              uVar23 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_9:
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 9;
                uVar24 = uVar23;
                uVar25 = uVar20;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
            uVar14 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar33 = (int)uVar23 * 2;
            uVar34 = (ulong)uVar33;
            uVar25 = uVar20 - uVar14;
            if (uVar20 < uVar14) {
              *(ushort *)((long)local_b8 + uVar23 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar20;
              uVar31 = uVar14;
            }
            else {
              uVar31 = uVar31 - uVar14;
              *(ushort *)((long)local_b8 + uVar23 * 2) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar33 | 1);
            }
          }
          else {
            sVar17 = 0;
            if (sVar29 <= local_e8) {
              sVar17 = sVar9;
            }
            local_d8 = (ulong)((uint)puVar8[sVar17 + ~local_e8 + sVar29] * 2);
            uVar15 = 0x100;
            uVar23 = 1;
switchD_001a2e9a_caseD_a:
            uVar14 = uVar15 & (uint)local_d8;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 10;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar19 = (ulong)((int)uVar23 + uVar15 + uVar14);
            uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
            uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar18;
            if (uVar33 < uVar18) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar14 = uVar14 ^ uVar15;
              uVar25 = uVar33;
              uVar31 = uVar18;
            }
            else {
              uVar31 = uVar31 - uVar18;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar23 = (ulong)uVar20;
            *(ushort *)((long)local_b8 + uVar19 * 2) = sVar11 + uVar2;
            local_d8 = (ulong)((uint)local_d8 * 2);
switchD_001a2e9a_caseD_b:
            uVar15 = uVar14 & (uint)local_d8;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xb;
                uVar24 = uVar23;
                uVar15 = uVar14;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar19 = (ulong)((int)uVar23 + uVar14 + uVar15);
            uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
            uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar18;
            if (uVar33 < uVar18) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar15 ^ uVar14;
              uVar25 = uVar33;
              uVar31 = uVar18;
            }
            else {
              uVar31 = uVar31 - uVar18;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar23 = (ulong)uVar20;
            *(ushort *)((long)local_b8 + uVar19 * 2) = sVar11 + uVar2;
            local_d8 = (ulong)((uint)local_d8 * 2);
switchD_001a2e9a_caseD_c:
            uVar14 = uVar15 & (uint)local_d8;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xc;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar19 = (ulong)((int)uVar23 + uVar15 + uVar14);
            uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
            uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar18;
            if (uVar33 < uVar18) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar14 = uVar14 ^ uVar15;
              uVar25 = uVar33;
              uVar31 = uVar18;
            }
            else {
              uVar31 = uVar31 - uVar18;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar23 = (ulong)uVar20;
            *(ushort *)((long)local_b8 + uVar19 * 2) = sVar11 + uVar2;
            local_d8 = (ulong)((uint)local_d8 * 2);
switchD_001a2e9a_caseD_d:
            uVar15 = uVar14 & (uint)local_d8;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xd;
                uVar24 = uVar23;
                uVar15 = uVar14;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar19 = (ulong)((int)uVar23 + uVar14 + uVar15);
            uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
            uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar18;
            if (uVar33 < uVar18) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar15 ^ uVar14;
              uVar25 = uVar33;
              uVar31 = uVar18;
            }
            else {
              uVar31 = uVar31 - uVar18;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar23 = (ulong)uVar20;
            *(ushort *)((long)local_b8 + uVar19 * 2) = sVar11 + uVar2;
            local_d8 = (ulong)((uint)local_d8 * 2);
switchD_001a2e9a_caseD_e:
            uVar14 = uVar15 & (uint)local_d8;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xe;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar19 = (ulong)((int)uVar23 + uVar15 + uVar14);
            uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
            uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar18;
            if (uVar33 < uVar18) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar14 = uVar14 ^ uVar15;
              uVar25 = uVar33;
              uVar31 = uVar18;
            }
            else {
              uVar31 = uVar31 - uVar18;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar23 = (ulong)uVar20;
            *(ushort *)((long)local_b8 + uVar19 * 2) = sVar11 + uVar2;
            local_d8 = (ulong)((uint)local_d8 * 2);
switchD_001a2e9a_caseD_f:
            uVar15 = uVar14 & (uint)local_d8;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xf;
                uVar24 = uVar23;
                uVar15 = uVar14;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar19 = (ulong)((int)uVar23 + uVar14 + uVar15);
            uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
            uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar18;
            if (uVar33 < uVar18) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar15 ^ uVar14;
              uVar25 = uVar33;
              uVar31 = uVar18;
            }
            else {
              uVar31 = uVar31 - uVar18;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar23 = (ulong)uVar20;
            *(ushort *)((long)local_b8 + uVar19 * 2) = sVar11 + uVar2;
            local_d8 = (ulong)((uint)local_d8 * 2);
switchD_001a2e9a_caseD_10:
            uVar14 = uVar15 & (uint)local_d8;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x10;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar19 = (ulong)((int)uVar23 + uVar15 + uVar14);
            uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
            uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar18;
            if (uVar33 < uVar18) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar14 = uVar14 ^ uVar15;
              uVar25 = uVar33;
              uVar31 = uVar18;
            }
            else {
              uVar31 = uVar31 - uVar18;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar23 = (ulong)uVar20;
            *(ushort *)((long)local_b8 + uVar19 * 2) = sVar11 + uVar2;
            local_d8 = (ulong)((uint)local_d8 * 2);
switchD_001a2e9a_caseD_11:
            uVar15 = uVar14 & (uint)local_d8;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x11;
                uVar24 = uVar23;
                uVar15 = uVar14;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar19 = (ulong)((int)uVar23 + uVar14 + uVar15);
            uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
            uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar18;
            if (uVar33 < uVar18) {
              *(ushort *)((long)local_b8 + uVar19 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar15 ^ uVar14;
              uVar25 = uVar33;
              uVar31 = uVar18;
            }
            else {
              uVar31 = uVar31 - uVar18;
              *(ushort *)((long)local_b8 + uVar19 * 2) = uVar2 - (uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar34 = (ulong)uVar20;
          }
          local_c8 = lzma_decode::next_state[local_c8];
switchD_001a2e9a_caseD_12:
          local_a8 = (uint)uVar34;
          if (sVar29 == sVar21) {
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x12;
            in_size = sVar30;
LAB_001a5ea8:
            bVar13 = false;
            bVar12 = true;
            lVar16 = LZMA_OK;
            sVar29 = sVar21;
            goto LAB_001a5f99;
          }
          puVar8[sVar29] = (uint8_t)uVar34;
          uVar23 = uVar34;
LAB_001a5639:
          sVar29 = sVar29 + 1;
          if (local_c0 < sVar29) {
            local_c0 = sVar29;
          }
        }
        else {
          uVar31 = uVar33 - uVar31;
          *puVar27 = uVar2 - (uVar2 >> 5);
switchD_001a2e9a_caseD_13:
          uVar33 = local_cc;
          local_a8 = (uint)uVar23;
          local_cc = local_c4;
          uVar25 = uVar20;
          uVar14 = uVar31;
          if (uVar31 < 0x1000000) {
            if (sVar30 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x13;
              bVar12 = true;
              lVar16 = LZMA_OK;
              sVar30 = in_size;
              local_cc = uVar33;
              goto LAB_001a6104;
            }
            pbVar1 = in + sVar30;
            sVar30 = sVar30 + 1;
            uVar25 = (uint)*pbVar1 | uVar20 << 8;
            uVar14 = uVar31 << 8;
          }
          uVar19 = (ulong)local_c8;
          uVar2 = *(ushort *)((long)coder_ptr + uVar19 * 2 + 0x6180);
          uVar31 = (uVar14 >> 0xb) * (uint)uVar2;
          uVar20 = uVar25 - uVar31;
          if (uVar25 < uVar31) {
            *(ushort *)((long)coder_ptr + uVar19 * 2 + 0x6180) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            local_c8 = (uint)(STATE_SHORTREP_LIT < local_c8) * 3 + STATE_LIT_MATCH;
            uVar23 = 1;
            local_94 = uVar33;
            local_c4 = (uint)local_e8;
switchD_001a2e9a_caseD_14:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x14;
                goto LAB_001a60be;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar25 = (uint)*pbVar1 | uVar25 << 8;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + 0x6664);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar20 = uVar25 - uVar31;
            if (uVar25 < uVar31) {
              *(ushort *)((long)coder_ptr + 0x6664) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_001a2e9a_caseD_15:
              uVar33 = uVar25;
              uVar20 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar30 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x15;
                  goto LAB_001a60be;
                }
                pbVar1 = in + sVar30;
                sVar30 = sVar30 + 1;
                uVar33 = (uint)*pbVar1 | uVar25 << 8;
                uVar20 = uVar31 << 8;
              }
              puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6668);
              uVar2 = *puVar27;
              uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
              uVar14 = (int)uVar23 * 2;
              uVar25 = uVar33 - uVar31;
              if (uVar33 < uVar31) {
                *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar25 = uVar33;
              }
              else {
                uVar31 = uVar20 - uVar31;
                *puVar27 = uVar2 - (uVar2 >> 5);
                uVar14 = uVar14 | 1;
              }
              uVar23 = (ulong)uVar14;
switchD_001a2e9a_caseD_16:
              uVar33 = uVar25;
              uVar20 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar30 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x16;
                  uVar24 = uVar23;
                  goto LAB_001a5f88;
                }
                pbVar1 = in + sVar30;
                sVar30 = sVar30 + 1;
                uVar33 = (uint)*pbVar1 | uVar25 << 8;
                uVar20 = uVar31 << 8;
              }
              puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6668);
              uVar2 = *puVar27;
              uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
              uVar14 = (int)uVar23 * 2;
              uVar25 = uVar33 - uVar31;
              if (uVar33 < uVar31) {
                *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar25 = uVar33;
              }
              else {
                uVar31 = uVar20 - uVar31;
                *puVar27 = uVar2 - (uVar2 >> 5);
                uVar14 = uVar14 | 1;
              }
              uVar23 = (ulong)uVar14;
switchD_001a2e9a_caseD_17:
              uVar33 = uVar25;
              if (uVar31 < 0x1000000) {
                if (sVar30 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x17;
                  uVar24 = uVar23;
                  goto LAB_001a5f88;
                }
                uVar31 = uVar31 << 8;
                pbVar1 = in + sVar30;
                sVar30 = sVar30 + 1;
                uVar33 = (uint)*pbVar1 | uVar25 << 8;
              }
              puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6668);
              uVar2 = *puVar27;
              uVar14 = (uVar31 >> 0xb) * (uint)uVar2;
              uVar20 = (int)uVar23 * 2;
              uVar25 = uVar33 - uVar14;
              if (uVar33 < uVar14) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar25 = uVar33;
              }
              else {
                uVar14 = uVar31 - uVar14;
                sVar11 = -(uVar2 >> 5);
                uVar20 = uVar20 | 1;
              }
              *puVar27 = sVar11 + uVar2;
              local_d8 = (ulong)(uVar20 - 6);
              uVar31 = uVar14;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)coder_ptr + 0x6664) = uVar2 - (uVar2 >> 5);
switchD_001a2e9a_caseD_18:
              uVar25 = uVar20;
              uVar33 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar30 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x18;
                  goto LAB_001a60be;
                }
                pbVar1 = in + sVar30;
                sVar30 = sVar30 + 1;
                uVar25 = (uint)*pbVar1 | uVar20 << 8;
                uVar33 = uVar31 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + 0x6666);
              uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar20 = uVar25 - uVar31;
              if (uVar25 < uVar31) {
                *(ushort *)((long)coder_ptr + 0x6666) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_001a2e9a_caseD_19:
                uVar33 = uVar25;
                uVar20 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x19;
                    goto LAB_001a60be;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                  uVar20 = uVar31 << 8;
                }
                puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6768);
                uVar2 = *puVar27;
                uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
                uVar14 = (int)uVar23 * 2;
                uVar25 = uVar33 - uVar31;
                if (uVar33 < uVar31) {
                  *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar25 = uVar33;
                }
                else {
                  uVar31 = uVar20 - uVar31;
                  *puVar27 = uVar2 - (uVar2 >> 5);
                  uVar14 = uVar14 | 1;
                }
                uVar23 = (ulong)uVar14;
switchD_001a2e9a_caseD_1a:
                uVar33 = uVar25;
                uVar20 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1a;
                    uVar24 = uVar23;
                    goto LAB_001a5f88;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                  uVar20 = uVar31 << 8;
                }
                puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6768);
                uVar2 = *puVar27;
                uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
                uVar14 = (int)uVar23 * 2;
                uVar25 = uVar33 - uVar31;
                if (uVar33 < uVar31) {
                  *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar25 = uVar33;
                }
                else {
                  uVar31 = uVar20 - uVar31;
                  *puVar27 = uVar2 - (uVar2 >> 5);
                  uVar14 = uVar14 | 1;
                }
                uVar23 = (ulong)uVar14;
switchD_001a2e9a_caseD_1b:
                uVar33 = uVar25;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1b;
                    uVar24 = uVar23;
                    goto LAB_001a5f88;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                }
                puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6768);
                uVar2 = *puVar27;
                uVar14 = (uVar31 >> 0xb) * (uint)uVar2;
                uVar20 = (int)uVar23 * 2;
                uVar25 = uVar33 - uVar14;
                if (uVar33 < uVar14) {
                  sVar11 = (short)(0x800 - uVar2 >> 5);
                  uVar25 = uVar33;
                  uVar31 = uVar14;
                }
                else {
                  uVar31 = uVar31 - uVar14;
                  sVar11 = -(uVar2 >> 5);
                  uVar20 = uVar20 | 1;
                }
                *puVar27 = sVar11 + uVar2;
                local_d8 = (ulong)(uVar20 + 2);
              }
              else {
                uVar31 = uVar33 - uVar31;
                *(ushort *)((long)coder_ptr + 0x6666) = uVar2 - (uVar2 >> 5);
switchD_001a2e9a_caseD_1c:
                uVar33 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1c;
                    uVar25 = uVar20;
                    goto LAB_001a5b0b;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar20 = (uint)*pbVar1 | uVar20 << 8;
                  uVar33 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868);
                uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
                uVar14 = (int)uVar23 * 2;
                uVar24 = (ulong)uVar14;
                uVar25 = uVar20 - uVar31;
                if (uVar20 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar25 = uVar20;
                }
                else {
                  uVar31 = uVar33 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar24 = (ulong)(uVar14 | 1);
                }
switchD_001a2e9a_caseD_1d:
                uVar33 = uVar25;
                uVar20 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1d;
                    goto LAB_001a5f88;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                  uVar20 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868);
                uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
                uVar14 = (int)uVar24 * 2;
                uVar34 = (ulong)uVar14;
                uVar25 = uVar33 - uVar31;
                if (uVar33 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar25 = uVar33;
                }
                else {
                  uVar31 = uVar20 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar34 = (ulong)(uVar14 | 1);
                }
switchD_001a2e9a_caseD_1e:
                uVar33 = uVar25;
                uVar20 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1e;
                    uVar24 = uVar34;
                    goto LAB_001a5f88;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                  uVar20 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868);
                uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
                uVar14 = (int)uVar34 * 2;
                uVar23 = (ulong)uVar14;
                uVar25 = uVar33 - uVar31;
                if (uVar33 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar25 = uVar33;
                }
                else {
                  uVar31 = uVar20 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar23 = (ulong)(uVar14 | 1);
                }
switchD_001a2e9a_caseD_1f:
                uVar33 = uVar25;
                uVar20 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1f;
                    uVar24 = uVar23;
                    goto LAB_001a5f88;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                  uVar20 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868);
                uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
                uVar14 = (int)uVar23 * 2;
                uVar24 = (ulong)uVar14;
                uVar25 = uVar33 - uVar31;
                if (uVar33 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar25 = uVar33;
                }
                else {
                  uVar31 = uVar20 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar24 = (ulong)(uVar14 | 1);
                }
switchD_001a2e9a_caseD_20:
                uVar33 = uVar25;
                uVar20 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x20;
                    goto LAB_001a5f88;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                  uVar20 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868);
                uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
                uVar14 = (int)uVar24 * 2;
                uVar23 = (ulong)uVar14;
                uVar25 = uVar33 - uVar31;
                if (uVar33 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar25 = uVar33;
                }
                else {
                  uVar31 = uVar20 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar23 = (ulong)(uVar14 | 1);
                }
switchD_001a2e9a_caseD_21:
                uVar33 = uVar25;
                uVar20 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x21;
                    uVar24 = uVar23;
                    goto LAB_001a5f88;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                  uVar20 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868);
                uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
                uVar14 = (int)uVar23 * 2;
                uVar24 = (ulong)uVar14;
                uVar25 = uVar33 - uVar31;
                if (uVar33 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar25 = uVar33;
                }
                else {
                  uVar31 = uVar20 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar24 = (ulong)(uVar14 | 1);
                }
switchD_001a2e9a_caseD_22:
                uVar33 = uVar25;
                uVar20 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x22;
                    goto LAB_001a5f88;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                  uVar20 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868);
                uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
                uVar14 = (int)uVar24 * 2;
                uVar23 = (ulong)uVar14;
                uVar25 = uVar33 - uVar31;
                if (uVar33 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar25 = uVar33;
                }
                else {
                  uVar31 = uVar20 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar23 = (ulong)(uVar14 | 1);
                }
switchD_001a2e9a_caseD_23:
                uVar33 = uVar25;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x23;
                    uVar24 = uVar23;
                    goto LAB_001a5f88;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar25 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868);
                uVar14 = (uVar31 >> 0xb) * (uint)uVar2;
                uVar20 = (int)uVar23 * 2;
                uVar25 = uVar33 - uVar14;
                if (uVar33 < uVar14) {
                  sVar11 = (short)(0x800 - uVar2 >> 5);
                  uVar25 = uVar33;
                  uVar31 = uVar14;
                }
                else {
                  uVar31 = uVar31 - uVar14;
                  sVar11 = -(uVar2 >> 5);
                  uVar20 = uVar20 | 1;
                }
                *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6868) = sVar11 + uVar2;
                local_d8 = (ulong)(uVar20 - 0xee);
              }
            }
            uVar23 = 3;
            if ((uint)local_d8 < 6) {
              uVar23 = (ulong)((uint)local_d8 - 2);
            }
            local_b8 = (void *)((long)coder_ptr + uVar23 * 0x80 + 0x6360);
            uVar24 = 1;
switchD_001a2e9a_caseD_24:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x24;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar24 * 2);
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar24 * 2;
            uVar23 = (ulong)uVar14;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *(ushort *)((long)local_b8 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *(ushort *)((long)local_b8 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
              uVar23 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_25:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x25;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar24 = (ulong)uVar14;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *(ushort *)((long)local_b8 + uVar23 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *(ushort *)((long)local_b8 + uVar23 * 2) = uVar2 - (uVar2 >> 5);
              uVar24 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_26:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x26;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar24 * 2);
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar24 * 2;
            uVar23 = (ulong)uVar14;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *(ushort *)((long)local_b8 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *(ushort *)((long)local_b8 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
              uVar23 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_27:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x27;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar24 = (ulong)uVar14;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *(ushort *)((long)local_b8 + uVar23 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *(ushort *)((long)local_b8 + uVar23 * 2) = uVar2 - (uVar2 >> 5);
              uVar24 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_28:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x28;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar25 = (uint)*pbVar1 | uVar25 << 8;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar24 * 2);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar24 * 2;
            uVar23 = (ulong)uVar14;
            uVar20 = uVar25 - uVar31;
            if (uVar25 < uVar31) {
              *(ushort *)((long)local_b8 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar20 = uVar25;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)local_b8 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
              uVar23 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_29:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x29;
                uVar24 = uVar23;
                uVar25 = uVar20;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar25 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar25 = uVar20;
            }
            else {
              uVar31 = uVar33 - uVar31;
              sVar11 = -(uVar2 >> 5);
              uVar14 = uVar14 | 1;
            }
            *(ushort *)((long)local_b8 + uVar23 * 2) = sVar11 + uVar2;
            uVar33 = uVar14 - 0x40;
            uVar23 = (ulong)uVar33;
            if (0x3f < uVar33) {
              __assert_fail("symbol <= 63",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x218,
                            "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            local_e8 = uVar23;
            if (uVar33 < 4) {
switchD_001a4d65_default:
              if (local_e8 < local_c0) goto LAB_001a5926;
            }
            else {
              uVar26 = (uVar33 >> 1) - 1;
              uVar20 = uVar14 & 1 | 2;
              local_e8 = (ulong)uVar20;
              if (uVar33 < 0xe) {
                if (5 < uVar26) {
                  __assert_fail("limit <= 5",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x227,
                                "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                uVar20 = uVar20 << ((byte)uVar26 & 0x1f);
                local_e8 = (ulong)uVar20;
                if ((int)(uVar20 - uVar14) < -0x40) {
                  __assert_fail("(int32_t)(rep0 - symbol - 1) >= -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x231,
                                "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                if (0x13 < (int)(uVar20 - uVar14)) {
                  __assert_fail("(int32_t)(rep0 - symbol - 1) <= 82",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x233,
                                "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                local_b8 = (void *)((long)coder_ptr + uVar23 * -2 + (ulong)uVar20 * 2 + 0x655e);
                uVar15 = 0;
                uVar23 = 1;
switchD_001a2e9a_caseD_2a:
                uVar19 = uVar23;
                uVar33 = uVar25;
                uVar20 = uVar25;
                switch(uVar26) {
                case 1:
                  goto switchD_001a4d65_caseD_1;
                case 2:
                  goto switchD_001a4d65_caseD_2;
                case 3:
                  goto switchD_001a4d65_caseD_3;
                case 4:
                  break;
                case 5:
                  if (uVar15 != 0) {
                    __assert_fail("offset == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                  ,0x242,
                                  "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                                 );
                  }
                  uVar26 = uVar31;
                  if (uVar31 < 0x1000000) {
                    if (sVar30 == in_size) {
                      *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                      uVar15 = 0;
                      uVar26 = 5;
                      goto LAB_001a5b0b;
                    }
                    pbVar1 = in + sVar30;
                    sVar30 = sVar30 + 1;
                    uVar25 = (uint)*pbVar1 | uVar25 << 8;
                    uVar26 = uVar31 << 8;
                  }
                  uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
                  uVar31 = (uVar26 >> 0xb) * (uint)uVar2;
                  uVar15 = (int)uVar23 * 2;
                  uVar19 = (ulong)uVar15;
                  uVar33 = uVar25 - uVar31;
                  if (uVar25 < uVar31) {
                    *(ushort *)((long)local_b8 + uVar23 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
                    uVar15 = 1;
                    uVar33 = uVar25;
                  }
                  else {
                    uVar31 = uVar26 - uVar31;
                    *(ushort *)((long)local_b8 + uVar23 * 2) = uVar2 - (uVar2 >> 5);
                    uVar19 = (ulong)(uVar15 | 1);
                    local_e8 = (ulong)((int)local_e8 + 1);
                    uVar15 = 1;
                  }
                  break;
                default:
                  goto switchD_001a4d65_default;
                }
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                    uVar26 = 4;
                    uVar23 = uVar19;
                    uVar25 = uVar33;
                    goto LAB_001a5b0b;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar33 << 8;
                }
                uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
                uVar20 = (uVar31 >> 0xb) * (uint)uVar2;
                uVar26 = (int)uVar19 * 2;
                uVar25 = uVar33 - uVar20;
                if (uVar33 < uVar20) {
                  sVar11 = (short)(0x800 - uVar2 >> 5);
                  uVar25 = uVar33;
                  uVar31 = uVar20;
                }
                else {
                  uVar31 = uVar31 - uVar20;
                  sVar11 = -(uVar2 >> 5);
                  uVar26 = uVar26 | 1;
                  local_e8 = (ulong)(uint)((1 << ((byte)uVar15 & 0x1f)) + (int)local_e8);
                }
                uVar23 = (ulong)uVar26;
                *(ushort *)((long)local_b8 + uVar19 * 2) = sVar11 + uVar2;
                uVar15 = uVar15 + 1;
switchD_001a4d65_caseD_3:
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                    uVar26 = 3;
                    goto LAB_001a5b0b;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar25 = (uint)*pbVar1 | uVar25 << 8;
                }
                uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
                uVar33 = (uVar31 >> 0xb) * (uint)uVar2;
                uVar26 = (int)uVar23 * 2;
                uVar20 = uVar25 - uVar33;
                if (uVar25 < uVar33) {
                  sVar11 = (short)(0x800 - uVar2 >> 5);
                  uVar20 = uVar25;
                  uVar31 = uVar33;
                }
                else {
                  uVar31 = uVar31 - uVar33;
                  sVar11 = -(uVar2 >> 5);
                  uVar26 = uVar26 | 1;
                  local_e8 = (ulong)(uint)((1 << ((byte)uVar15 & 0x1f)) + (int)local_e8);
                }
                uVar19 = (ulong)uVar26;
                *(ushort *)((long)local_b8 + uVar23 * 2) = sVar11 + uVar2;
                uVar15 = uVar15 + 1;
switchD_001a4d65_caseD_2:
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                    uVar26 = 2;
                    uVar23 = uVar19;
                    uVar25 = uVar20;
                    goto LAB_001a5b0b;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar20 = (uint)*pbVar1 | uVar20 << 8;
                }
                uVar2 = *(ushort *)((long)local_b8 + uVar19 * 2);
                uVar26 = (uVar31 >> 0xb) * (uint)uVar2;
                uVar25 = (int)uVar19 * 2;
                uVar33 = uVar20 - uVar26;
                if (uVar20 < uVar26) {
                  sVar11 = (short)(0x800 - uVar2 >> 5);
                  uVar33 = uVar20;
                  uVar31 = uVar26;
                }
                else {
                  uVar31 = uVar31 - uVar26;
                  sVar11 = -(uVar2 >> 5);
                  uVar25 = uVar25 | 1;
                  local_e8 = (ulong)(uint)((1 << ((byte)uVar15 & 0x1f)) + (int)local_e8);
                }
                uVar23 = (ulong)uVar25;
                *(ushort *)((long)local_b8 + uVar19 * 2) = sVar11 + uVar2;
                uVar15 = uVar15 + 1;
switchD_001a4d65_caseD_1:
                uVar26 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                    uVar26 = 1;
                    uVar25 = uVar33;
                    goto LAB_001a5b0b;
                  }
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar33 = (uint)*pbVar1 | uVar33 << 8;
                  uVar26 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)local_b8 + uVar23 * 2);
                uVar31 = (uVar26 >> 0xb) * (uint)uVar2;
                uVar25 = uVar33 - uVar31;
                if (uVar33 < uVar31) {
                  *(ushort *)((long)local_b8 + uVar23 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar26 = 1;
                  uVar25 = uVar33;
                }
                else {
                  uVar31 = uVar26 - uVar31;
                  *(ushort *)((long)local_b8 + uVar23 * 2) = uVar2 - (uVar2 >> 5);
                  uVar26 = 1;
                  local_e8 = (ulong)(uint)((1 << ((byte)uVar15 & 0x1f)) + (int)local_e8);
                }
                goto switchD_001a4d65_default;
              }
              if (uVar26 < 6) {
                __assert_fail("limit >= 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x26b,
                              "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              uVar26 = (uVar33 >> 1) - 5;
switchD_001a2e9a_caseD_2b:
              do {
                if (uVar31 < 0x1000000) {
                  if (sVar30 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2b;
                    goto LAB_001a5b0b;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + sVar30;
                  sVar30 = sVar30 + 1;
                  uVar25 = uVar25 << 8 | (uint)*pbVar1;
                }
                uVar31 = uVar31 >> 1;
                uVar33 = (int)(uVar25 - uVar31) >> 0x1f;
                uVar20 = uVar33 + (int)local_e8 * 2 + 1;
                local_e8 = (ulong)uVar20;
                uVar25 = (uVar33 & uVar31) + (uVar25 - uVar31);
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
              local_e8 = (ulong)(uVar20 * 0x10);
              uVar26 = 0;
              uVar23 = 1;
switchD_001a2e9a_caseD_2c:
              uVar33 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar30 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2c;
                  goto LAB_001a5b0b;
                }
                pbVar1 = in + sVar30;
                sVar30 = sVar30 + 1;
                uVar25 = (uint)*pbVar1 | uVar25 << 8;
                uVar33 = uVar31 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6644);
              uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar14 = (int)uVar23 * 2;
              uVar24 = (ulong)uVar14;
              uVar20 = uVar25 - uVar31;
              if (uVar25 < uVar31) {
                *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6644) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar20 = uVar25;
              }
              else {
                uVar31 = uVar33 - uVar31;
                *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
                uVar24 = (ulong)(uVar14 | 1);
                local_e8 = (ulong)((int)local_e8 + 1);
              }
switchD_001a2e9a_caseD_2d:
              uVar33 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar30 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2d;
                  uVar25 = uVar20;
                  goto LAB_001a5f88;
                }
                pbVar1 = in + sVar30;
                sVar30 = sVar30 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar33 = uVar31 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6644);
              uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar14 = (int)uVar24 * 2;
              uVar34 = (ulong)uVar14;
              uVar25 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6644) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar25 = uVar20;
              }
              else {
                uVar31 = uVar33 - uVar31;
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
                uVar34 = (ulong)(uVar14 | 1);
                local_e8 = (ulong)((int)local_e8 + 2);
              }
switchD_001a2e9a_caseD_2e:
              uVar33 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar30 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2e;
                  uVar24 = uVar34;
                  goto LAB_001a5f88;
                }
                pbVar1 = in + sVar30;
                sVar30 = sVar30 + 1;
                uVar25 = (uint)*pbVar1 | uVar25 << 8;
                uVar33 = uVar31 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6644);
              uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar14 = (int)uVar34 * 2;
              uVar23 = (ulong)uVar14;
              uVar20 = uVar25 - uVar31;
              if (uVar25 < uVar31) {
                *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6644) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar20 = uVar25;
              }
              else {
                uVar31 = uVar33 - uVar31;
                *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
                uVar23 = (ulong)(uVar14 | 1);
                local_e8 = (ulong)((int)local_e8 + 4);
              }
switchD_001a2e9a_caseD_2f:
              uVar33 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar30 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2f;
                  uVar24 = uVar23;
                  uVar25 = uVar20;
                  goto LAB_001a5f88;
                }
                pbVar1 = in + sVar30;
                sVar30 = sVar30 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar33 = uVar31 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6644);
              uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar25 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar25 = uVar20;
              }
              else {
                uVar31 = uVar33 - uVar31;
                sVar11 = -(uVar2 >> 5);
                local_e8 = (ulong)((int)local_e8 + 8);
              }
              *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6644) = sVar11 + uVar2;
              if ((int)local_e8 != -1) goto switchD_001a4d65_default;
              local_e8 = 0xffffffff;
              if (*(long *)((long)coder_ptr + 0x6e98) == -1) {
                local_e8 = 0xffffffff;
                goto switchD_001a2e9a_caseD_30;
              }
            }
            local_a8 = (uint)uVar23;
            lVar16 = LZMA_DATA_ERROR;
            bVar12 = false;
            bVar13 = false;
            in_size = sVar30;
            goto LAB_001a5f99;
          }
          uVar31 = uVar14 - uVar31;
          *(ushort *)((long)coder_ptr + uVar19 * 2 + 0x6180) = uVar2 - (uVar2 >> 5);
          local_cc = uVar33;
          if (local_c0 == 0) {
            lVar16 = LZMA_DATA_ERROR;
            local_c0 = 0;
            bVar12 = false;
            uVar25 = uVar20;
            goto LAB_001a6104;
          }
switchD_001a2e9a_caseD_31:
          uVar25 = uVar20;
          uVar33 = uVar31;
          if (uVar31 < 0x1000000) {
            if (sVar30 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x31;
              goto LAB_001a60be;
            }
            pbVar1 = in + sVar30;
            sVar30 = sVar30 + 1;
            uVar25 = (uint)*pbVar1 | uVar20 << 8;
            uVar33 = uVar31 << 8;
          }
          uVar19 = (ulong)local_c8;
          uVar2 = *(ushort *)((long)coder_ptr + uVar19 * 2 + 0x6198);
          uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar20 = uVar25 - uVar31;
          if (uVar25 < uVar31) {
            *(ushort *)((long)coder_ptr + uVar19 * 2 + 0x6198) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
switchD_001a2e9a_caseD_33:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x33;
                goto LAB_001a60be;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar25 = (uint)*pbVar1 | uVar25 << 8;
              uVar33 = uVar31 << 8;
            }
            puVar27 = (ushort *)((long)coder_ptr + local_b0 * 2 + (ulong)local_c8 * 0x20 + 0x61e0);
            uVar2 = *puVar27;
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            if (uVar31 <= uVar25) {
              *puVar27 = uVar2 - (uVar2 >> 5);
              uVar20 = local_c4;
              uVar23 = local_e8;
              uVar25 = uVar25 - uVar31;
              uVar31 = uVar33 - uVar31;
              local_c4 = local_cc;
              local_e8._0_4_ = uVar20;
              goto LAB_001a390a;
            }
            *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
            local_c8 = (uint)(STATE_SHORTREP_LIT < local_c8) * 2 + STATE_LIT_SHORTREP;
switchD_001a2e9a_caseD_32:
            if (sVar29 != sVar21) {
              sVar17 = 0;
              if (sVar29 <= local_e8) {
                sVar17 = sVar9;
              }
              puVar8[sVar29] = puVar8[sVar17 + sVar29 + ~local_e8];
              goto LAB_001a5639;
            }
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x32;
            in_size = sVar30;
            sVar29 = sVar21;
            goto LAB_001a5b0b;
          }
          uVar31 = uVar33 - uVar31;
          *(ushort *)((long)coder_ptr + uVar19 * 2 + 0x6198) = uVar2 - (uVar2 >> 5);
switchD_001a2e9a_caseD_34:
          if (uVar31 < 0x1000000) {
            if (sVar30 != in_size) {
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              goto LAB_001a37a1;
            }
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x34;
            uVar25 = uVar20;
LAB_001a60be:
            local_a8 = (uint)uVar23;
            goto LAB_001a5f94;
          }
LAB_001a37a1:
          uVar19 = (ulong)local_c8;
          uVar2 = *(ushort *)((long)coder_ptr + uVar19 * 2 + 0x61b0);
          uVar33 = (uVar31 >> 0xb) * (uint)uVar2;
          uVar25 = uVar20 - uVar33;
          if (uVar20 < uVar33) {
            *(ushort *)((long)coder_ptr + uVar19 * 2 + 0x61b0) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar23 = (ulong)local_c4;
            uVar25 = uVar20;
            uVar31 = uVar33;
            local_c4 = local_cc;
          }
          else {
            uVar31 = uVar31 - uVar33;
            *(ushort *)((long)coder_ptr + uVar19 * 2 + 0x61b0) = uVar2 - (uVar2 >> 5);
            uVar24 = uVar23;
switchD_001a2e9a_caseD_35:
            uVar33 = local_94;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x35;
                goto LAB_001a5f88;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar25 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar23 = (ulong)local_c8;
            uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x61c8);
            uVar14 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = uVar25 - uVar14;
            if (uVar25 < uVar14) {
              *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x61c8) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar20 = uVar25;
              uVar33 = local_cc;
            }
            else {
              uVar14 = uVar31 - uVar14;
              *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x61c8) = uVar2 - (uVar2 >> 5);
              local_94 = local_cc;
            }
            uVar23 = (ulong)uVar33;
            uVar25 = uVar20;
            uVar31 = uVar14;
          }
LAB_001a390a:
          uVar33 = (uint)local_e8;
          local_c8 = (uint)(STATE_SHORTREP_LIT < local_c8) * 3 + STATE_LIT_LONGREP;
          uVar24 = 1;
          local_e8 = uVar23;
          local_cc = local_c4;
          local_c4 = uVar33;
switchD_001a2e9a_caseD_36:
          uVar33 = uVar31;
          if (uVar31 < 0x1000000) {
            if (sVar30 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x36;
              goto LAB_001a5f88;
            }
            pbVar1 = in + sVar30;
            sVar30 = sVar30 + 1;
            uVar25 = (uint)*pbVar1 | uVar25 << 8;
            uVar33 = uVar31 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + 0x6a68);
          uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar20 = uVar25 - uVar31;
          uVar23 = uVar24;
          if (uVar25 < uVar31) {
            *(ushort *)((long)coder_ptr + 0x6a68) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_001a2e9a_caseD_37:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x37;
                goto LAB_001a60be;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6a6c);
            uVar2 = *puVar27;
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *puVar27 = uVar2 - (uVar2 >> 5);
              uVar14 = uVar14 | 1;
            }
            uVar23 = (ulong)uVar14;
switchD_001a2e9a_caseD_38:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x38;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6a6c);
            uVar2 = *puVar27;
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *puVar27 = uVar2 - (uVar2 >> 5);
              uVar14 = uVar14 | 1;
            }
            uVar23 = (ulong)uVar14;
            uVar33 = (uint)local_d8;
switchD_001a2e9a_caseD_39:
            local_d8._0_4_ = uVar33;
            uVar33 = uVar25;
            if (0xffffff < uVar31) {
LAB_001a3b1b:
              puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6a6c);
              uVar2 = *puVar27;
              uVar14 = (uVar31 >> 0xb) * (uint)uVar2;
              uVar20 = (int)uVar23 * 2;
              uVar25 = uVar33 - uVar14;
              if (uVar33 < uVar14) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar25 = uVar33;
                uVar31 = uVar14;
              }
              else {
                uVar31 = uVar31 - uVar14;
                sVar11 = -(uVar2 >> 5);
                uVar20 = uVar20 | 1;
              }
              *puVar27 = sVar11 + uVar2;
              uVar33 = uVar20 - 6;
              goto LAB_001a4cce;
            }
            if (sVar30 != in_size) {
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              goto LAB_001a3b1b;
            }
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x39;
            sVar21 = sVar29;
LAB_001a5ea3:
            local_a8 = (uint)uVar23;
            goto LAB_001a5ea8;
          }
          uVar31 = uVar33 - uVar31;
          *(ushort *)((long)coder_ptr + 0x6a68) = uVar2 - (uVar2 >> 5);
switchD_001a2e9a_caseD_3a:
          uVar25 = uVar20;
          uVar33 = uVar31;
          if (uVar31 < 0x1000000) {
            if (sVar30 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3a;
              goto LAB_001a60be;
            }
            pbVar1 = in + sVar30;
            sVar30 = sVar30 + 1;
            uVar25 = (uint)*pbVar1 | uVar20 << 8;
            uVar33 = uVar31 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + 0x6a6a);
          uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar20 = uVar25 - uVar31;
          if (uVar25 < uVar31) {
            *(ushort *)((long)coder_ptr + 0x6a6a) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_001a2e9a_caseD_3b:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3b;
                goto LAB_001a60be;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6b6c);
            uVar2 = *puVar27;
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *puVar27 = uVar2 - (uVar2 >> 5);
              uVar14 = uVar14 | 1;
            }
            uVar23 = (ulong)uVar14;
switchD_001a2e9a_caseD_3c:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3c;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6b6c);
            uVar2 = *puVar27;
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *puVar27 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *puVar27 = uVar2 - (uVar2 >> 5);
              uVar14 = uVar14 | 1;
            }
            uVar23 = (ulong)uVar14;
            uVar33 = (uint)local_d8;
switchD_001a2e9a_caseD_3d:
            local_d8._0_4_ = uVar33;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3d;
                sVar21 = sVar29;
                goto LAB_001a5ea3;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            puVar27 = (ushort *)((long)coder_ptr + uVar23 * 2 + local_b0 * 0x10 + 0x6b6c);
            uVar2 = *puVar27;
            uVar14 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar14;
            if (uVar33 < uVar14) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar25 = uVar33;
              uVar31 = uVar14;
            }
            else {
              uVar31 = uVar31 - uVar14;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            *puVar27 = sVar11 + uVar2;
            uVar33 = uVar20 + 2;
          }
          else {
            uVar31 = uVar33 - uVar31;
            *(ushort *)((long)coder_ptr + 0x6a6a) = uVar2 - (uVar2 >> 5);
switchD_001a2e9a_caseD_3e:
            uVar33 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3e;
                uVar25 = uVar20;
                goto LAB_001a5b0b;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              uVar33 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c);
            uVar31 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar24 = (ulong)uVar14;
            uVar25 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar20;
            }
            else {
              uVar31 = uVar33 - uVar31;
              *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar24 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_3f:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3f;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c);
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar24 * 2;
            uVar34 = (ulong)uVar14;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_40:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x40;
                uVar24 = uVar34;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c);
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar34 * 2;
            uVar23 = (ulong)uVar14;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar23 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_41:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x41;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c);
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar24 = (ulong)uVar14;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar24 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_42:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x42;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c);
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar24 * 2;
            uVar23 = (ulong)uVar14;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar23 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_43:
            uVar33 = uVar25;
            uVar20 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x43;
                uVar24 = uVar23;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
              uVar20 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c);
            uVar31 = (uVar20 >> 0xb) * (uint)uVar2;
            uVar14 = (int)uVar23 * 2;
            uVar24 = (ulong)uVar14;
            uVar25 = uVar33 - uVar31;
            if (uVar33 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar33;
            }
            else {
              uVar31 = uVar20 - uVar31;
              *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar24 = (ulong)(uVar14 | 1);
            }
switchD_001a2e9a_caseD_44:
            uVar20 = uVar25;
            uVar14 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x44;
                goto LAB_001a5f88;
              }
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar20 = (uint)*pbVar1 | uVar25 << 8;
              uVar14 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c);
            uVar31 = (uVar14 >> 0xb) * (uint)uVar2;
            uVar18 = (int)uVar24 * 2;
            uVar23 = (ulong)uVar18;
            uVar25 = uVar20 - uVar31;
            uVar33 = (uint)local_d8;
            if (uVar20 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar25 = uVar20;
            }
            else {
              uVar31 = uVar14 - uVar31;
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar23 = (ulong)(uVar18 | 1);
            }
switchD_001a2e9a_caseD_45:
            local_d8._0_4_ = uVar33;
            uVar33 = uVar25;
            if (uVar31 < 0x1000000) {
              if (sVar30 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x45;
                sVar21 = sVar29;
                goto LAB_001a5ea3;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar30;
              sVar30 = sVar30 + 1;
              uVar33 = (uint)*pbVar1 | uVar25 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c);
            uVar14 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar23 * 2;
            uVar25 = uVar33 - uVar14;
            if (uVar33 < uVar14) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar25 = uVar33;
              uVar31 = uVar14;
            }
            else {
              uVar31 = uVar31 - uVar14;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            *(ushort *)((long)coder_ptr + uVar23 * 2 + 0x6c6c) = sVar11 + uVar2;
            uVar33 = uVar20 - 0xee;
          }
LAB_001a4cce:
          uVar23 = (ulong)uVar20;
          local_d8 = (ulong)uVar33;
LAB_001a5926:
          if ((uint)local_d8 < 2) {
            __assert_fail("len >= MATCH_LEN_MIN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x311,
                          "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          if (0x111 < (uint)local_d8) {
            __assert_fail("len <= MATCH_LEN_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x312,
                          "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
switchD_001a2e9a_caseD_46:
          local_a8 = (uint)uVar23;
          uVar19 = sVar21 - sVar29;
          if (local_d8 <= sVar21 - sVar29) {
            uVar19 = local_d8;
          }
          uVar34 = uVar19 & 0xffffffff;
          uVar33 = (uint)uVar19;
          local_d8._0_4_ = (int)local_d8 - uVar33;
          if ((uint)local_e8 < uVar33) {
            do {
              sVar17 = sVar9;
              if (local_e8 < sVar29) {
                sVar17 = 0;
              }
              puVar8[sVar29] = puVar8[sVar29 + sVar17 + ~local_e8];
              sVar29 = sVar29 + 1;
              uVar33 = (int)uVar34 - 1;
              uVar34 = (ulong)uVar33;
            } while (uVar33 != 0);
          }
          else {
            if (local_e8 < sVar29) {
              __dest = puVar8 + sVar29;
              uVar34 = uVar19 & 0xffffffff;
              __src = __dest + ~local_e8;
LAB_001a5a4a:
              memcpy(__dest,__src,uVar34);
            }
            else {
              if (local_c0 != sVar9) {
                __assert_fail("dict->full == dict->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_decoder.h"
                              ,0x9d,"_Bool dict_repeat(lzma_dict *, uint32_t, uint32_t *)");
              }
              iVar32 = ~(uint)local_e8 + (int)sVar29;
              uVar20 = -iVar32;
              if (uVar20 < uVar33) {
                memmove(puVar8 + sVar29,puVar8 + (uint)((int)sVar9 + iVar32),(ulong)uVar20);
                sVar29 = sVar29 + uVar20;
                uVar34 = (ulong)(uVar33 + iVar32);
                __dest = puVar8 + sVar29;
                __src = puVar8;
                goto LAB_001a5a4a;
              }
              memmove(puVar8 + sVar29,puVar8 + (uint)((int)sVar9 + iVar32),uVar34);
            }
            sVar29 = sVar29 + uVar34;
          }
          if (local_c0 <= sVar29) {
            local_c0 = sVar29;
          }
          if ((uint)local_d8 != 0) goto LAB_001a5b6d;
          local_d8 = 0;
        }
        local_b0 = (ulong)(uVar3 & (uint)sVar29);
      } while( true );
    case 2:
      goto switchD_001a2e9a_caseD_2;
    case 3:
      goto switchD_001a2e9a_caseD_3;
    case 4:
      goto switchD_001a2e9a_caseD_4;
    case 5:
      goto switchD_001a2e9a_caseD_5;
    case 6:
      goto switchD_001a2e9a_caseD_6;
    case 7:
      goto switchD_001a2e9a_caseD_7;
    case 8:
      goto switchD_001a2e9a_caseD_8;
    case 9:
      goto switchD_001a2e9a_caseD_9;
    case 10:
      goto switchD_001a2e9a_caseD_a;
    case 0xb:
      goto switchD_001a2e9a_caseD_b;
    case 0xc:
      goto switchD_001a2e9a_caseD_c;
    case 0xd:
      goto switchD_001a2e9a_caseD_d;
    case 0xe:
      goto switchD_001a2e9a_caseD_e;
    case 0xf:
      goto switchD_001a2e9a_caseD_f;
    case 0x10:
      goto switchD_001a2e9a_caseD_10;
    case 0x11:
      goto switchD_001a2e9a_caseD_11;
    case 0x12:
      goto switchD_001a2e9a_caseD_12;
    case 0x13:
      goto switchD_001a2e9a_caseD_13;
    case 0x14:
      goto switchD_001a2e9a_caseD_14;
    case 0x15:
      goto switchD_001a2e9a_caseD_15;
    case 0x16:
      goto switchD_001a2e9a_caseD_16;
    case 0x17:
      goto switchD_001a2e9a_caseD_17;
    case 0x18:
      goto switchD_001a2e9a_caseD_18;
    case 0x19:
      goto switchD_001a2e9a_caseD_19;
    case 0x1a:
      goto switchD_001a2e9a_caseD_1a;
    case 0x1b:
      goto switchD_001a2e9a_caseD_1b;
    case 0x1c:
      goto switchD_001a2e9a_caseD_1c;
    case 0x1d:
      goto switchD_001a2e9a_caseD_1d;
    case 0x1e:
      goto switchD_001a2e9a_caseD_1e;
    case 0x1f:
      goto switchD_001a2e9a_caseD_1f;
    case 0x20:
      goto switchD_001a2e9a_caseD_20;
    case 0x21:
      goto switchD_001a2e9a_caseD_21;
    case 0x22:
      goto switchD_001a2e9a_caseD_22;
    case 0x23:
      goto switchD_001a2e9a_caseD_23;
    case 0x24:
      goto switchD_001a2e9a_caseD_24;
    case 0x25:
      goto switchD_001a2e9a_caseD_25;
    case 0x26:
      goto switchD_001a2e9a_caseD_26;
    case 0x27:
      goto switchD_001a2e9a_caseD_27;
    case 0x28:
      goto switchD_001a2e9a_caseD_28;
    case 0x29:
      goto switchD_001a2e9a_caseD_29;
    case 0x2a:
      goto switchD_001a2e9a_caseD_2a;
    case 0x2b:
      goto switchD_001a2e9a_caseD_2b;
    case 0x2c:
      goto switchD_001a2e9a_caseD_2c;
    case 0x2d:
      goto switchD_001a2e9a_caseD_2d;
    case 0x2e:
      goto switchD_001a2e9a_caseD_2e;
    case 0x2f:
      goto switchD_001a2e9a_caseD_2f;
    case 0x30:
      goto switchD_001a2e9a_caseD_30;
    case 0x31:
      goto switchD_001a2e9a_caseD_31;
    case 0x32:
      goto switchD_001a2e9a_caseD_32;
    case 0x33:
      goto switchD_001a2e9a_caseD_33;
    case 0x34:
      goto switchD_001a2e9a_caseD_34;
    case 0x35:
      goto switchD_001a2e9a_caseD_35;
    case 0x36:
      goto switchD_001a2e9a_caseD_36;
    case 0x37:
      goto switchD_001a2e9a_caseD_37;
    case 0x38:
      goto switchD_001a2e9a_caseD_38;
    case 0x39:
      goto switchD_001a2e9a_caseD_39;
    case 0x3a:
      goto switchD_001a2e9a_caseD_3a;
    case 0x3b:
      goto switchD_001a2e9a_caseD_3b;
    case 0x3c:
      goto switchD_001a2e9a_caseD_3c;
    case 0x3d:
      goto switchD_001a2e9a_caseD_3d;
    case 0x3e:
      goto switchD_001a2e9a_caseD_3e;
    case 0x3f:
      goto switchD_001a2e9a_caseD_3f;
    case 0x40:
      goto switchD_001a2e9a_caseD_40;
    case 0x41:
      goto switchD_001a2e9a_caseD_41;
    case 0x42:
      goto switchD_001a2e9a_caseD_42;
    case 0x43:
      goto switchD_001a2e9a_caseD_43;
    case 0x44:
      goto switchD_001a2e9a_caseD_44;
    case 0x45:
      goto switchD_001a2e9a_caseD_45;
    case 0x46:
      goto switchD_001a2e9a_caseD_46;
    }
  }
  local_d8._0_4_ = uVar33;
  if (uVar31 < 0x1000000) {
    if (sVar30 != in_size) {
      uVar31 = uVar31 << 8;
      uVar25 = (uint)in[sVar30] | uVar25 << 8;
      sVar30 = sVar30 + 1;
      goto LAB_001a2ec5;
    }
    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0;
  }
  else {
LAB_001a2ec5:
    in_size = sVar30;
    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
  }
  bVar13 = false;
  bVar12 = true;
  lVar16 = LZMA_OK;
  sVar29 = sVar17;
LAB_001a5f99:
  dictptr->pos = sVar29;
  dictptr->full = local_c0;
  *(uint *)((long)coder_ptr + 0x6e6c) = uVar31;
  *(uint *)((long)coder_ptr + 0x6e70) = uVar25;
  *(undefined4 *)((long)coder_ptr + 0x6e74) = 0;
  *in_pos = in_size;
  *(lzma_lzma_state *)((long)coder_ptr + 0x6e78) = local_c8;
  *(uint *)((long)coder_ptr + 0x6e7c) = (uint)local_e8;
  *(uint *)((long)coder_ptr + 0x6e80) = local_c4;
  *(uint *)((long)coder_ptr + 0x6e84) = local_cc;
  *(uint *)((long)coder_ptr + 0x6e88) = local_94;
  *(void **)((long)coder_ptr + 0x6ea8) = local_b8;
  *(uint *)((long)coder_ptr + 0x6eb0) = local_a8;
  *(uint *)((long)coder_ptr + 0x6eb4) = uVar26;
  *(uint *)((long)coder_ptr + 0x6eb8) = uVar15;
  *(uint *)((long)coder_ptr + 0x6ebc) = (uint)local_d8;
  if ((*(long *)((long)coder_ptr + 0x6e98) == -1) ||
     (lVar28 = *(long *)((long)coder_ptr + 0x6e98) + (sVar6 - sVar29),
     *(long *)((long)coder_ptr + 0x6e98) = lVar28, !bVar12 || lVar28 != 0)) {
    if (!bVar13) {
      return lVar16;
    }
  }
  else {
    if (*(int *)((long)coder_ptr + 0x6ea0) == 0) {
      return LZMA_OK;
    }
    if (*(int *)((long)coder_ptr + 0x6ea0) != 1) {
      return LZMA_DATA_ERROR;
    }
  }
  *(undefined8 *)((long)coder_ptr + 0x6e6c) = 0xffffffff;
  *(undefined4 *)((long)coder_ptr + 0x6e74) = 5;
  return (uint)(uVar25 != 0) * 8 + LZMA_STREAM_END;
switchD_001a2e9a_caseD_30:
  local_a8 = (uint)uVar23;
  lVar16 = LZMA_STREAM_END;
  if (uVar31 < 0x1000000) {
    if (sVar30 == in_size) {
      *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x30;
LAB_001a5b0b:
      local_a8 = (uint)uVar23;
      bVar13 = false;
      bVar12 = true;
      lVar16 = LZMA_OK;
      goto LAB_001a5f99;
    }
    uVar31 = uVar31 << 8;
    pbVar1 = in + sVar30;
    sVar30 = sVar30 + 1;
    uVar25 = (uint)*pbVar1 | uVar25 << 8;
  }
  bVar12 = false;
  bVar13 = true;
  in_size = sVar30;
  goto LAB_001a5f99;
LAB_001a5b6d:
  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x46;
  bVar12 = true;
  lVar16 = LZMA_OK;
LAB_001a6104:
  bVar13 = false;
  in_size = sVar30;
  goto LAB_001a5f99;
}

Assistant:

static lzma_ret
lzma_decode(void *coder_ptr, lzma_dict *restrict dictptr,
		const uint8_t *restrict in,
		size_t *restrict in_pos, size_t in_size)
{
	lzma_lzma1_decoder *restrict coder = coder_ptr;

	////////////////////
	// Initialization //
	////////////////////

	{
		const lzma_ret ret = rc_read_init(
				&coder->rc, in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			return ret;
	}

	///////////////
	// Variables //
	///////////////

	// Making local copies of often-used variables improves both
	// speed and readability.

	lzma_dict dict = *dictptr;

	const size_t dict_start = dict.pos;

	// Range decoder
	rc_to_local(coder->rc, *in_pos);

	// State
	uint32_t state = coder->state;
	uint32_t rep0 = coder->rep0;
	uint32_t rep1 = coder->rep1;
	uint32_t rep2 = coder->rep2;
	uint32_t rep3 = coder->rep3;

	const uint32_t pos_mask = coder->pos_mask;

	// These variables are actually needed only if we last time ran
	// out of input in the middle of the decoder loop.
	probability *probs = coder->probs;
	uint32_t symbol = coder->symbol;
	uint32_t limit = coder->limit;
	uint32_t offset = coder->offset;
	uint32_t len = coder->len;

	const uint32_t literal_pos_mask = coder->literal_pos_mask;
	const uint32_t literal_context_bits = coder->literal_context_bits;

	// Temporary variables
	uint32_t pos_state = dict.pos & pos_mask;

	lzma_ret ret = LZMA_OK;

	// If uncompressed size is known, there must be no end of payload
	// marker.
	const bool no_eopm = coder->uncompressed_size
			!= LZMA_VLI_UNKNOWN;
	if (no_eopm && coder->uncompressed_size < dict.limit - dict.pos)
		dict.limit = dict.pos + (size_t)(coder->uncompressed_size);

	// The main decoder loop. The "switch" is used to restart the decoder at
	// correct location. Once restarted, the "switch" is no longer used.
	switch (coder->sequence)
	while (true) {
		// Calculate new pos_state. This is skipped on the first loop
		// since we already calculated it when setting up the local
		// variables.
		pos_state = dict.pos & pos_mask;

	case SEQ_NORMALIZE:
	case SEQ_IS_MATCH:
		if (unlikely(no_eopm && dict.pos == dict.limit))
			break;

		rc_if_0(coder->is_match[state][pos_state], SEQ_IS_MATCH) {
			rc_update_0(coder->is_match[state][pos_state]);

			// It's a literal i.e. a single 8-bit byte.

			probs = literal_subcoder(coder->literal,
					literal_context_bits, literal_pos_mask,
					dict.pos, dict_get(&dict, 0));
			symbol = 1;

			if (is_literal_state(state)) {
				// Decode literal without match byte.
#ifdef HAVE_SMALL
	case SEQ_LITERAL:
				do {
					rc_bit(probs[symbol], , , SEQ_LITERAL);
				} while (symbol < (1 << 8));
#else
				rc_bit_case(probs[symbol], , , SEQ_LITERAL0);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL1);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL2);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL3);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL4);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL5);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL6);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL7);
#endif
			} else {
				// Decode literal with match byte.
				//
				// We store the byte we compare against
				// ("match byte") to "len" to minimize the
				// number of variables we need to store
				// between decoder calls.
				len = (uint32_t)(dict_get(&dict, rep0)) << 1;

				// The usage of "offset" allows omitting some
				// branches, which should give tiny speed
				// improvement on some CPUs. "offset" gets
				// set to zero if match_bit didn't match.
				offset = 0x100;

#ifdef HAVE_SMALL
	case SEQ_LITERAL_MATCHED:
				do {
					const uint32_t match_bit
							= len & offset;
					const uint32_t subcoder_index
							= offset + match_bit
							+ symbol;

					rc_bit(probs[subcoder_index],
							offset &= ~match_bit,
							offset &= match_bit,
							SEQ_LITERAL_MATCHED);

					// It seems to be faster to do this
					// here instead of putting it to the
					// beginning of the loop and then
					// putting the "case" in the middle
					// of the loop.
					len <<= 1;

				} while (symbol < (1 << 8));
#else
				// Unroll the loop.
				uint32_t match_bit;
				uint32_t subcoder_index;

#	define d(seq) \
		case seq: \
			match_bit = len & offset; \
			subcoder_index = offset + match_bit + symbol; \
			rc_bit(probs[subcoder_index], \
					offset &= ~match_bit, \
					offset &= match_bit, \
					seq)

				d(SEQ_LITERAL_MATCHED0);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED1);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED2);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED3);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED4);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED5);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED6);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED7);
#	undef d
#endif
			}

			//update_literal(state);
			// Use a lookup table to update to literal state,
			// since compared to other state updates, this would
			// need two branches.
			static const lzma_lzma_state next_state[] = {
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_MATCH_LIT_LIT,
				STATE_REP_LIT_LIT,
				STATE_SHORTREP_LIT_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT,
				STATE_SHORTREP_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT
			};
			state = next_state[state];

	case SEQ_LITERAL_WRITE:
			if (unlikely(dict_put(&dict, symbol))) {
				coder->sequence = SEQ_LITERAL_WRITE;
				goto out;
			}

			continue;
		}

		// Instead of a new byte we are going to get a byte range
		// (distance and length) which will be repeated from our
		// output history.

		rc_update_1(coder->is_match[state][pos_state]);

	case SEQ_IS_REP:
		rc_if_0(coder->is_rep[state], SEQ_IS_REP) {
			// Not a repeated match
			rc_update_0(coder->is_rep[state]);
			update_match(state);

			// The latest three match distances are kept in
			// memory in case there are repeated matches.
			rep3 = rep2;
			rep2 = rep1;
			rep1 = rep0;

			// Decode the length of the match.
			len_decode(len, coder->match_len_decoder,
					pos_state, SEQ_MATCH_LEN);

			// Prepare to decode the highest two bits of the
			// match distance.
			probs = coder->dist_slot[get_dist_state(len)];
			symbol = 1;

#ifdef HAVE_SMALL
	case SEQ_DIST_SLOT:
			do {
				rc_bit(probs[symbol], , , SEQ_DIST_SLOT);
			} while (symbol < DIST_SLOTS);
#else
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT0);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT1);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT2);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT3);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT4);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT5);
#endif
			// Get rid of the highest bit that was needed for
			// indexing of the probability array.
			symbol -= DIST_SLOTS;
			assert(symbol <= 63);

			if (symbol < DIST_MODEL_START) {
				// Match distances [0, 3] have only two bits.
				rep0 = symbol;
			} else {
				// Decode the lowest [1, 29] bits of
				// the match distance.
				limit = (symbol >> 1) - 1;
				assert(limit >= 1 && limit <= 30);
				rep0 = 2 + (symbol & 1);

				if (symbol < DIST_MODEL_END) {
					// Prepare to decode the low bits for
					// a distance of [4, 127].
					assert(limit <= 5);
					rep0 <<= limit;
					assert(rep0 <= 96);
					// -1 is fine, because we start
					// decoding at probs[1], not probs[0].
					// NOTE: This violates the C standard,
					// since we are doing pointer
					// arithmetic past the beginning of
					// the array.
					assert((int32_t)(rep0 - symbol - 1)
							>= -1);
					assert((int32_t)(rep0 - symbol - 1)
							<= 82);
					probs = coder->pos_special + rep0
							- symbol - 1;
					symbol = 1;
					offset = 0;
	case SEQ_DIST_MODEL:
#ifdef HAVE_SMALL
					do {
						rc_bit(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
					} while (++offset < limit);
#else
					switch (limit) {
					case 5:
						assert(offset == 0);
						rc_bit(probs[symbol], ,
							rep0 += 1U,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 4:
						rc_bit(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 3:
						rc_bit(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 2:
						rc_bit(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 1:
						// We need "symbol" only for
						// indexing the probability
						// array, thus we can use
						// rc_bit_last() here to omit
						// the unneeded updating of
						// "symbol".
						rc_bit_last(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
					}
#endif
				} else {
					// The distance is >= 128. Decode the
					// lower bits without probabilities
					// except the lowest four bits.
					assert(symbol >= 14);
					assert(limit >= 6);
					limit -= ALIGN_BITS;
					assert(limit >= 2);
	case SEQ_DIRECT:
					// Not worth manual unrolling
					do {
						rc_direct(rep0, SEQ_DIRECT);
					} while (--limit > 0);

					// Decode the lowest four bits using
					// probabilities.
					rep0 <<= ALIGN_BITS;
					symbol = 1;
#ifdef HAVE_SMALL
					offset = 0;
	case SEQ_ALIGN:
					do {
						rc_bit(coder->pos_align[
								symbol], ,
							rep0 += 1U << offset,
							SEQ_ALIGN);
					} while (++offset < ALIGN_BITS);
#else
	case SEQ_ALIGN0:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 1, SEQ_ALIGN0);
	case SEQ_ALIGN1:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 2, SEQ_ALIGN1);
	case SEQ_ALIGN2:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 4, SEQ_ALIGN2);
	case SEQ_ALIGN3:
					// Like in SEQ_DIST_MODEL, we don't
					// need "symbol" for anything else
					// than indexing the probability array.
					rc_bit_last(coder->pos_align[symbol], ,
							rep0 += 8, SEQ_ALIGN3);
#endif

					if (rep0 == UINT32_MAX) {
						// End of payload marker was
						// found. It must not be
						// present if uncompressed
						// size is known.
						if (coder->uncompressed_size
						!= LZMA_VLI_UNKNOWN) {
							ret = LZMA_DATA_ERROR;
							goto out;
						}

	case SEQ_EOPM:
						// LZMA1 stream with
						// end-of-payload marker.
						rc_normalize(SEQ_EOPM);
						ret = LZMA_STREAM_END;
						goto out;
					}
				}
			}

			// Validate the distance we just decoded.
			if (unlikely(!dict_is_distance_valid(&dict, rep0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

		} else {
			rc_update_1(coder->is_rep[state]);

			// Repeated match
			//
			// The match distance is a value that we have had
			// earlier. The latest four match distances are
			// available as rep0, rep1, rep2 and rep3. We will
			// now decode which of them is the new distance.
			//
			// There cannot be a match if we haven't produced
			// any output, so check that first.
			if (unlikely(!dict_is_distance_valid(&dict, 0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

	case SEQ_IS_REP0:
			rc_if_0(coder->is_rep0[state], SEQ_IS_REP0) {
				rc_update_0(coder->is_rep0[state]);
				// The distance is rep0.

	case SEQ_IS_REP0_LONG:
				rc_if_0(coder->is_rep0_long[state][pos_state],
						SEQ_IS_REP0_LONG) {
					rc_update_0(coder->is_rep0_long[
							state][pos_state]);

					update_short_rep(state);

	case SEQ_SHORTREP:
					if (unlikely(dict_put(&dict, dict_get(
							&dict, rep0)))) {
						coder->sequence = SEQ_SHORTREP;
						goto out;
					}

					continue;
				}

				// Repeating more than one byte at
				// distance of rep0.
				rc_update_1(coder->is_rep0_long[
						state][pos_state]);

			} else {
				rc_update_1(coder->is_rep0[state]);

	case SEQ_IS_REP1:
				// The distance is rep1, rep2 or rep3. Once
				// we find out which one of these three, it
				// is stored to rep0 and rep1, rep2 and rep3
				// are updated accordingly.
				rc_if_0(coder->is_rep1[state], SEQ_IS_REP1) {
					rc_update_0(coder->is_rep1[state]);

					const uint32_t distance = rep1;
					rep1 = rep0;
					rep0 = distance;

				} else {
					rc_update_1(coder->is_rep1[state]);
	case SEQ_IS_REP2:
					rc_if_0(coder->is_rep2[state],
							SEQ_IS_REP2) {
						rc_update_0(coder->is_rep2[
								state]);

						const uint32_t distance = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;

					} else {
						rc_update_1(coder->is_rep2[
								state]);

						const uint32_t distance = rep3;
						rep3 = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;
					}
				}
			}

			update_long_rep(state);

			// Decode the length of the repeated match.
			len_decode(len, coder->rep_len_decoder,
					pos_state, SEQ_REP_LEN);
		}

		/////////////////////////////////
		// Repeat from history buffer. //
		/////////////////////////////////

		// The length is always between these limits. There is no way
		// to trigger the algorithm to set len outside this range.
		assert(len >= MATCH_LEN_MIN);
		assert(len <= MATCH_LEN_MAX);

	case SEQ_COPY:
		// Repeat len bytes from distance of rep0.
		if (unlikely(dict_repeat(&dict, rep0, &len))) {
			coder->sequence = SEQ_COPY;
			goto out;
		}
	}

	rc_normalize(SEQ_NORMALIZE);
	coder->sequence = SEQ_IS_MATCH;

out:
	// Save state

	// NOTE: Must not copy dict.limit.
	dictptr->pos = dict.pos;
	dictptr->full = dict.full;

	rc_from_local(coder->rc, *in_pos);

	coder->state = state;
	coder->rep0 = rep0;
	coder->rep1 = rep1;
	coder->rep2 = rep2;
	coder->rep3 = rep3;

	coder->probs = probs;
	coder->symbol = symbol;
	coder->limit = limit;
	coder->offset = offset;
	coder->len = len;

	// Update the remaining amount of uncompressed data if uncompressed
	// size was known.
	if (coder->uncompressed_size != LZMA_VLI_UNKNOWN) {
		coder->uncompressed_size -= dict.pos - dict_start;

		// Since there cannot be end of payload marker if the
		// uncompressed size was known, we check here if we
		// finished decoding.
		if (coder->uncompressed_size == 0 && ret == LZMA_OK
				&& coder->sequence != SEQ_NORMALIZE)
			ret = coder->sequence == SEQ_IS_MATCH
					? LZMA_STREAM_END : LZMA_DATA_ERROR;
	}

	// We can do an additional check in the range decoder to catch some
	// corrupted files.
	if (ret == LZMA_STREAM_END) {
		if (!rc_is_finished(coder->rc))
			ret = LZMA_DATA_ERROR;

		// Reset the range decoder so that it is ready to reinitialize
		// for a new LZMA2 chunk.
		rc_reset(coder->rc);
	}

	return ret;
}